

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O2

int mbedtls_pkcs5_pbkdf2_hmac
              (mbedtls_md_context_t *ctx,uchar *password,size_t plen,uchar *salt,size_t slen,
              uint iteration_count,uint32_t key_length,uchar *output)

{
  uchar *puVar1;
  uint32_t uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong __n;
  uchar local_e4 [4];
  uint32_t local_e0;
  uint local_dc;
  uchar *local_d8;
  ulong local_d0;
  uchar *local_c8;
  size_t local_c0;
  uchar work [64];
  uchar md1 [64];
  
  local_d8 = output;
  local_dc = iteration_count;
  local_c8 = salt;
  local_c0 = slen;
  bVar3 = mbedtls_md_get_size(ctx->md_info);
  local_e4[0] = '\0';
  local_e4[1] = '\0';
  local_e4[2] = '\0';
  local_e4[3] = '\x01';
  __n = (ulong)bVar3;
  do {
    if (key_length == 0) {
      return 0;
    }
    local_e0 = key_length;
    iVar4 = mbedtls_md_hmac_starts(ctx,password,plen);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = mbedtls_md_hmac_update(ctx,local_c8,local_c0);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = mbedtls_md_hmac_update(ctx,local_e4,4);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = mbedtls_md_hmac_finish(ctx,work);
    if (iVar4 != 0) {
      return iVar4;
    }
    memcpy(md1,work,__n);
    for (uVar7 = 1; uVar2 = local_e0, uVar7 < local_dc; uVar7 = uVar7 + 1) {
      iVar4 = mbedtls_md_hmac_starts(ctx,password,plen);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = mbedtls_md_hmac_update(ctx,md1,__n);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = mbedtls_md_hmac_finish(ctx,md1);
      if (iVar4 != 0) {
        return iVar4;
      }
      for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
        work[uVar5] = work[uVar5] ^ md1[uVar5];
      }
    }
    uVar7 = (uint)bVar3;
    if (local_e0 < bVar3) {
      uVar7 = local_e0;
    }
    local_d0 = (ulong)uVar7;
    memcpy(local_d8,work,local_d0);
    key_length = uVar2 - (int)local_d0;
    local_d8 = local_d8 + local_d0;
    uVar5 = 3;
    do {
      if (uVar5 == 0xffffffffffffffff) break;
      uVar6 = uVar5 & 0xffffffff;
      uVar5 = uVar5 - 1;
      puVar1 = local_e4 + uVar6;
      *puVar1 = *puVar1 + '\x01';
    } while (*puVar1 == '\0');
  } while( true );
}

Assistant:

int mbedtls_pkcs5_pbkdf2_hmac( mbedtls_md_context_t *ctx, const unsigned char *password,
                       size_t plen, const unsigned char *salt, size_t slen,
                       unsigned int iteration_count,
                       uint32_t key_length, unsigned char *output )
{
    int ret, j;
    unsigned int i;
    unsigned char md1[MBEDTLS_MD_MAX_SIZE];
    unsigned char work[MBEDTLS_MD_MAX_SIZE];
    unsigned char md_size = mbedtls_md_get_size( ctx->md_info );
    size_t use_len;
    unsigned char *out_p = output;
    unsigned char counter[4];

    memset( counter, 0, 4 );
    counter[3] = 1;

    if( iteration_count > 0xFFFFFFFF )
        return( MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA );

    while( key_length )
    {
        // U1 ends up in work
        //
        if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, salt, slen ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_update( ctx, counter, 4 ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_md_hmac_finish( ctx, work ) ) != 0 )
            return( ret );

        memcpy( md1, work, md_size );

        for( i = 1; i < iteration_count; i++ )
        {
            // U2 ends up in md1
            //
            if( ( ret = mbedtls_md_hmac_starts( ctx, password, plen ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_update( ctx, md1, md_size ) ) != 0 )
                return( ret );

            if( ( ret = mbedtls_md_hmac_finish( ctx, md1 ) ) != 0 )
                return( ret );

            // U1 xor U2
            //
            for( j = 0; j < md_size; j++ )
                work[j] ^= md1[j];
        }

        use_len = ( key_length < md_size ) ? key_length : md_size;
        memcpy( out_p, work, use_len );

        key_length -= (uint32_t) use_len;
        out_p += use_len;

        for( i = 4; i > 0; i-- )
            if( ++counter[i - 1] != 0 )
                break;
    }

    return( 0 );
}